

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O1

void __thiscall GcHeap::GcHeapImpl::VerifyHeap(GcHeapImpl *this)

{
  size_type sVar1;
  _List_node_base *p_Var2;
  undefined1 local_b8 [8];
  unordered_set<Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<Sexp_*>_> visited;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  Sexp *local_50;
  Sexp *ptr;
  vector<Sexp_*,_std::allocator<Sexp_*>_> stack;
  
  DebugLog("[%d] verifying heap",this->gc_number);
  ptr = (Sexp *)0x0;
  stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b8 = (undefined1  [8])&visited._M_h._M_rehash_policy._M_next_resize;
  visited._M_h._M_buckets = (__buckets_ptr)0x1;
  visited._M_h._M_bucket_count = 0;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count._0_4_ = 0x3f800000;
  visited._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visited._M_h._M_rehash_policy._4_4_ = 0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  ScanRoots<GcHeap::GcHeapImpl::VerifyHeap()::_lambda(Sexp**)_1_>
            ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)&ptr);
  p_Var2 = (this->finalize_queue).super__List_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->finalize_queue) {
    do {
      if (stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::vector<Sexp*,std::allocator<Sexp*>>::_M_realloc_insert<Sexp*const&>
                  ((vector<Sexp*,std::allocator<Sexp*>> *)&ptr,
                   (iterator)
                   stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                   super__Vector_impl_data._M_start,(Sexp **)(p_Var2 + 1));
      }
      else {
        *stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
         _M_start = (Sexp *)p_Var2[1]._M_next;
        stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
        _M_start = stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
      }
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != (_List_node_base *)&this->finalize_queue);
  }
  if (ptr != (Sexp *)stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                     super__Vector_impl_data._M_start) {
    do {
      local_50 = stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                 super__Vector_impl_data._M_start[-1];
      stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data.
      _M_start = stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                 super__Vector_impl_data._M_start + -1;
      sVar1 = std::
              _Hashtable<Sexp_*,_Sexp_*,_std::allocator<Sexp_*>,_std::__detail::_Identity,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count((_Hashtable<Sexp_*,_Sexp_*,_std::allocator<Sexp_*>,_std::__detail::_Identity,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_b8,&local_50);
      if (sVar1 == 0) {
        visited._M_h._M_single_bucket = (__node_base_ptr)local_b8;
        std::
        _Hashtable<Sexp*,Sexp*,std::allocator<Sexp*>,std::__detail::_Identity,std::equal_to<Sexp*>,std::hash<Sexp*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<Sexp*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Sexp*,false>>>>
                  ((_Hashtable<Sexp*,Sexp*,std::allocator<Sexp*>,std::__detail::_Identity,std::equal_to<Sexp*>,std::hash<Sexp*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_b8,&local_50,&visited._M_h._M_single_bucket);
        if ((local_50 < (Sexp *)this->heap_start) || ((Sexp *)this->heap_end < local_50)) {
          __assert_fail("(uint8_t *)ptr >= heap_start && (uint8_t *)ptr <= heap_end && \"pointer not in heap!\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                        ,0x199,"void GcHeap::GcHeapImpl::VerifyHeap()");
        }
        if (local_50->padding == 0xabababababababab) {
          __assert_fail("ptr->padding != 0xabababababababab && \"observed a pointer that has been relocated!\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                        ,0x19b,"void GcHeap::GcHeapImpl::VerifyHeap()");
        }
        local_78._8_8_ = 0;
        local_78._M_unused._M_object = &ptr;
        pcStack_60 = std::
                     _Function_handler<void_(Sexp_**),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp:412:26)>
                     ::_M_invoke;
        local_68 = std::
                   _Function_handler<void_(Sexp_**),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp:412:26)>
                   ::_M_manager;
        Sexp::TracePointers(local_50,(function<void_(Sexp_**)> *)&local_78);
        if (local_68 != (code *)0x0) {
          (*local_68)(&local_78,&local_78,__destroy_functor);
        }
      }
    } while (ptr != (Sexp *)stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<Sexp_*,_Sexp_*,_std::allocator<Sexp_*>,_std::__detail::_Identity,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Sexp_*,_Sexp_*,_std::allocator<Sexp_*>,_std::__detail::_Identity,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_b8);
  if (ptr != (Sexp *)0x0) {
    operator_delete(ptr,(long)stack.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)ptr);
  }
  return;
}

Assistant:

void VerifyHeap() {
// The basic idea here is to traverse the entire
// heap and verify that every pointer is 1) within
// the valid heap range (i.e. we didn't accidentally introduce
// any wild pointers during a GC) and to ensure that every pointer
// points to a non-relocated object.
//
// When an object is relocated in a debug build, it is replaced
// with the bit pattern 0xab - if we see a pointer here that
// observes that bit pattern, we know that we failed to update
// a pointer somewhere.
#ifdef DEBUG
    DebugLog("[%d] verifying heap", gc_number);
    std::vector<Sexp *> stack;
    std::unordered_set<Sexp *> visited;
    ScanRoots([&](Sexp **ptr) {
      if (ptr == nullptr || *ptr == nullptr) {
        return;
      }

      if ((*ptr)->IsEmpty()) {
        return;
      }

      stack.push_back(*ptr);
    });

    // make sure we relocated the finalize queue right
    for (auto &it : finalize_queue) {
      stack.push_back(it);
    }

    while (!stack.empty()) {
      Sexp *ptr = stack.back();
      stack.pop_back();
      if (visited.count(ptr) != 0) {
        continue;
      }

      visited.insert(ptr);
      assert((uint8_t *)ptr >= heap_start && (uint8_t *)ptr <= heap_end &&
             "pointer not in heap!");
      assert(ptr->padding != 0xabababababababab &&
             "observed a pointer that has been relocated!");
      ptr->TracePointers([&](Sexp **child) {
        assert(child != nullptr && "passed a null pointer to TracePointers!");
        assert(*child != nullptr && "observed a null pointer!");
        if ((*child)->IsEmpty()) {
          return;
        }

        stack.push_back(*child);
      });

      // DebugLog("heap verify: object %s is reachable",
      // ptr->DumpString().c_str());
    }
#endif
  }